

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O1

Box * __thiscall amrex::MFIter::tilebox(Box *__return_storage_ptr__,MFIter *this)

{
  pointer pBVar1;
  IntVect *pIVar2;
  int iVar3;
  uint uVar4;
  pointer pBVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int dir;
  uint uVar9;
  long lVar10;
  uint uVar11;
  Box local_2c;
  
  iVar3 = this->currentIndex;
  pBVar5 = (this->tile_array->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = pBVar5 + iVar3;
  uVar6 = *(undefined8 *)(pBVar1->smallend).vect;
  uVar7 = *(undefined8 *)((long)(pBVar1->smallend).vect + 8);
  pIVar2 = &pBVar5[iVar3].bigend;
  uVar8 = *(undefined8 *)((long)pIVar2->vect + 8);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)pIVar2->vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar8;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar6;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar7;
  uVar4 = (this->typ).itype;
  if (uVar4 != 0) {
    lVar10 = 0;
    do {
      uVar11 = 1 << ((byte)lVar10 & 0x1f);
      uVar9 = (uint)lVar10;
      (__return_storage_ptr__->bigend).vect[lVar10] =
           ((__return_storage_ptr__->bigend).vect[lVar10] +
           (uint)((uVar4 >> (uVar9 & 0x1f) & 1) != 0)) -
           (uint)(((__return_storage_ptr__->btype).itype >> (uVar9 & 0x1f) & 1) != 0);
      if ((uVar4 >> (uVar9 & 0x1f) & 1) == 0) {
        uVar11 = ~uVar11 & (__return_storage_ptr__->btype).itype;
      }
      else {
        uVar11 = uVar11 | (__return_storage_ptr__->btype).itype;
      }
      (__return_storage_ptr__->btype).itype = uVar11;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    BATransformer::operator()
              (&local_2c,&(this->fabArray->boxarray).m_bat,
               (Box *)((long)(this->index_map->super_vector<int,_std::allocator<int>_>).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar3] * 0x1c +
                      *(long *)&(((this->fabArray->boxarray).m_ref.
                                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data));
    uVar4 = (this->typ).itype;
    lVar10 = 0;
    do {
      if (((uVar4 >> ((uint)lVar10 & 0x1f) & 1) != 0) &&
         (iVar3 = (__return_storage_ptr__->bigend).vect[lVar10],
         iVar3 < local_2c.bigend.vect[lVar10])) {
        (__return_storage_ptr__->bigend).vect[lVar10] = iVar3 + -1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

Box
MFIter::tilebox () const noexcept
{
    BL_ASSERT(tile_array != 0);
    Box bx((*tile_array)[currentIndex]);
    if (! typ.cellCentered())
    {
        bx.convert(typ);
        const Box& vbx = validbox();
        const IntVect& Big = vbx.bigEnd();
        for (int d=0; d<AMREX_SPACEDIM; ++d) {
            if (typ.nodeCentered(d)) { // validbox should also be nodal in d-direction.
                if (bx.bigEnd(d) < Big[d]) {
                    bx.growHi(d,-1);
                }
            }
        }
    }
    return bx;
}